

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O1

void Abc_SclPrintBufferTrees(SC_Man *p,Abc_Ntk_t *pNtk)

{
  Abc_Obj_t *pObj;
  Abc_Obj_t *pObj_00;
  int iVar1;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  
  pVVar2 = pNtk->vObjs;
  if (0 < pVVar2->nSize) {
    lVar5 = 0;
    do {
      pObj = (Abc_Obj_t *)pVVar2->pArray[lVar5];
      if ((pObj != (Abc_Obj_t *)0x0) &&
         ((uVar4 = *(uint *)&pObj->field_0x14 & 0xf, uVar4 != 7 || ((pObj->vFanins).nSize != 1)))) {
        iVar1 = Abc_SclCountBufferFanoutsInt(pObj);
        iVar3 = 0;
        if (uVar4 == 7) {
          iVar3 = -(uint)((pObj->vFanins).nSize == 1);
        }
        if (3 < iVar3 + iVar1) {
          Abc_SclPrintBuffersOne(p,pObj,0);
          if (0 < (pObj->vFanouts).nSize) {
            lVar6 = 0;
            do {
              pObj_00 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar6]];
              if (((*(uint *)&pObj_00->field_0x14 & 0xf) == 7) && ((pObj_00->vFanins).nSize == 1)) {
                Abc_SclPrintBuffersInt(p,pObj_00,1);
              }
              lVar6 = lVar6 + 1;
            } while (lVar6 < (pObj->vFanouts).nSize);
          }
          putchar(10);
        }
      }
      lVar5 = lVar5 + 1;
      pVVar2 = pNtk->vObjs;
    } while (lVar5 < pVVar2->nSize);
  }
  return;
}

Assistant:

void Abc_SclPrintBufferTrees( SC_Man * p, Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj, * pFanout;
    int i, k;
    Abc_NtkForEachObj( pNtk, pObj, i )
    {
        if ( !Abc_ObjIsBuffer(pObj) && Abc_SclCountBufferFanouts(pObj) > 3 )
        {           
            Abc_SclPrintBuffersOne( p, pObj, 0 );
            Abc_ObjForEachFanout( pObj, pFanout, k )
                if ( Abc_ObjIsBuffer(pFanout) )
                    Abc_SclPrintBuffersInt( p, pFanout, 1 );
            printf( "\n" );
        }
    }
}